

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  TestStatus *pTVar1;
  undefined8 instance;
  int iVar2;
  TestError *pTVar3;
  ulong uVar4;
  long lVar5;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceProperties2KHR extProperties;
  InstanceDriver vki;
  VkPhysicalDeviceProperties coreProperties;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_868;
  VkAllocationCallbacks *local_850;
  DestroyInstanceFunc local_848;
  TestStatus *local_840;
  undefined1 local_838 [16];
  VkAllocationCallbacks *local_828 [103];
  InstanceDriver local_4f0;
  VkPhysicalDeviceProperties local_368;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)local_838,vkp,(char *)context);
  instance = local_838._0_8_;
  local_848 = (DestroyInstanceFunc)local_838._8_8_;
  local_850 = local_828[0];
  ::vk::InstanceDriver::InstanceDriver(&local_4f0,vkp,(VkInstance)local_838._0_8_);
  local_840 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices(&local_868,&local_4f0.super_InstanceInterface,(VkInstance)instance)
  ;
  if (local_868.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_868.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      local_838._0_4_ = 0x3b9bb079;
      local_838._8_8_ = (DestroyInstanceFunc)0x0;
      ::vk::InstanceDriver::getPhysicalDeviceProperties
                (&local_4f0,
                 local_868.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4],&local_368);
      ::vk::InstanceDriver::getPhysicalDeviceProperties2KHR
                (&local_4f0,
                 local_868.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4],
                 (VkPhysicalDeviceProperties2KHR *)local_838);
      if (local_838._0_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,(char *)0x0,
                   "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8cd);
LAB_0044b002:
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((DestroyInstanceFunc)local_838._8_8_ != (DestroyInstanceFunc)0x0) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,(char *)0x0,"extProperties.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8ce);
        goto LAB_0044b002;
      }
      lVar5 = 8;
      do {
        iVar2 = bcmp(local_368.deviceName + *(long *)(&UNK_00aff048 + lVar5) + -0x14,
                     (void *)((long)local_828 + *(long *)(&UNK_00aff048 + lVar5)),
                     *(size_t *)
                      ((long)&api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable +
                      lVar5));
        if (iVar2 != 0) {
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,
                     "Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x8dc);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x768);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_868.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_868.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_838._0_8_ = (VkInstance_s *)local_828;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_838,"Querying device properties succeeded","");
  pTVar1 = local_840;
  local_840->m_code = QP_TEST_RESULT_PASS;
  (local_840->m_description)._M_dataplus._M_p = (pointer)&(local_840->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_840->m_description,local_838._0_8_,
             (DestroyInstanceFunc)(local_838._8_8_ + local_838._0_8_));
  if ((VkInstance_s *)local_838._0_8_ != (VkInstance_s *)local_828) {
    operator_delete((void *)local_838._0_8_,(ulong)((long)&local_828[0]->pUserData + 1));
  }
  if (local_868.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_868.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_868.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_868.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_4f0);
  if ((VkInstance)instance != (VkInstance)0x0) {
    (*local_848)((VkInstance)instance,local_850);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus deviceProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceProperties		coreProperties;
		VkPhysicalDeviceProperties2KHR	extProperties;

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		// We can't use memcmp() here because the structs may contain padding bytes that drivers may or may not
		// have written while writing the data and memcmp will compare them anyway, so we iterate through the
		// valid bytes for each field in the struct and compare only the valid bytes for each one.
		for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(s_physicalDevicePropertiesOffsetTable); propNdx++)
		{
			const size_t offset					= s_physicalDevicePropertiesOffsetTable[propNdx].offset;
			const size_t size					= s_physicalDevicePropertiesOffsetTable[propNdx].size;

			const deUint8* corePropertyBytes	= reinterpret_cast<deUint8*>(&coreProperties) + offset;
			const deUint8* extPropertyBytes		= reinterpret_cast<deUint8*>(&extProperties.properties) + offset;

			if (deMemCmp(corePropertyBytes, extPropertyBytes, size) != 0)
				TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR");
		}
	}

	return tcu::TestStatus::pass("Querying device properties succeeded");
}